

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *arg,QList<QList<QString>_> *list)

{
  byte bVar1;
  QList<QList<QString>_> *in_RSI;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QList<QString> item;
  parameter_type in_stack_ffffffffffffffc8;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QList<QString>_>::clear(in_RSI);
  while( true ) {
    bVar1 = QDBusArgument::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0xb17854);
    QDBusArgument::operator>>(in_RDI,(QList_conflict3 *)&local_20);
    QList<QList<QString>_>::push_back(in_RSI,in_stack_ffffffffffffffc8);
    QList<QString>::~QList((QList<QString> *)0xb1787c);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}